

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfs.c
# Opt level: O2

lws_plat_file_ops * lws_vfs_select_fops(lws_plat_file_ops *fops,char *vfs_path,char **vpath)

{
  byte bVar1;
  char *__s2;
  lws_plat_file_ops *plVar2;
  int iVar3;
  long lVar4;
  lws_plat_file_ops **pplVar5;
  char *pcVar6;
  
  *vpath = (char *)0x0;
  if (fops->next != (lws_plat_file_ops *)0x0) {
    for (pcVar6 = vfs_path; pcVar6 != (char *)0x0; pcVar6 = pcVar6 + 1) {
      pplVar5 = &fops->next;
      if (*pcVar6 == '/') {
        while (plVar2 = *pplVar5, plVar2 != (lws_plat_file_ops *)0x0) {
          for (lVar4 = 0x30;
              (lVar4 != 0x60 &&
              (__s2 = *(char **)((long)(plVar2->fi + -3) + lVar4), __s2 != (char *)0x0));
              lVar4 = lVar4 + 0x10) {
            bVar1 = *(byte *)((long)plVar2->fi + lVar4 + -0x28);
            if ((vfs_path + bVar1 <= pcVar6) &&
               (iVar3 = strncmp(pcVar6 + (1 - (ulong)bVar1),__s2,(ulong)(bVar1 - 1)), iVar3 == 0)) {
              *vpath = pcVar6 + 1;
              return plVar2;
            }
          }
          pplVar5 = &plVar2->next;
        }
      }
      else if (*pcVar6 == '\0') {
        return fops;
      }
    }
  }
  return fops;
}

Assistant:

const struct lws_plat_file_ops *
lws_vfs_select_fops(const struct lws_plat_file_ops *fops, const char *vfs_path,
		    const char **vpath)
{
	const struct lws_plat_file_ops *pf;
	const char *p = vfs_path;
	int n;

	*vpath = NULL;

	/* no non-platform fops, just use that */

	if (!fops->next)
		return fops;

	/*
	 *  scan the vfs path looking for indications we are to be
	 * handled by a specific fops
	 */

	while (p && *p) {
		if (*p != '/') {
			p++;
			continue;
		}
		/* the first one is always platform fops, so skip */
		pf = fops->next;
		while (pf) {
			n = 0;
			while (n < (int)LWS_ARRAY_SIZE(pf->fi) && pf->fi[n].sig) {
				if (p >= vfs_path + pf->fi[n].len)
					if (!strncmp(p - (pf->fi[n].len - 1),
						     pf->fi[n].sig,
						     (unsigned int)(pf->fi[n].len - 1))) {
						*vpath = p + 1;
						return pf;
					}

				n++;
			}
			pf = pf->next;
		}
		p++;
	}

	return fops;
}